

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

void test_modinv64_uint16(uint16_t *out,uint16_t *in,uint16_t *mod)

{
  int64_t *piVar1;
  int iVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int64_t iVar10;
  undefined8 uVar11;
  code *pcVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  uint64_t uVar16;
  long lVar17;
  byte bVar18;
  int iVar19;
  uint uVar20;
  long lVar21;
  ulong uVar22;
  secp256k1_modinv64_modinfo *modinfo;
  ulong uVar23;
  secp256k1_modinv64_signed62 *psVar24;
  secp256k1_modinv64_signed62 *psVar25;
  uint16_t *out_00;
  uint uVar26;
  int iVar27;
  ulong uVar28;
  char cVar29;
  int iVar30;
  code *pcVar31;
  int iVar32;
  secp256k1_modinv64_signed62 x;
  secp256k1_modinv64_modinfo m;
  uint16_t tmp [16];
  uint16_t negone [16];
  int iStack_194;
  secp256k1_modinv32_trans2x2 sStack_190;
  undefined8 uStack_180;
  secp256k1_modinv32_signed30 sStack_178;
  int iStack_14c;
  secp256k1_modinv32_signed30 sStack_148;
  uint16_t *puStack_120;
  ulong uStack_118;
  code *pcStack_110;
  uint16_t *puStack_108;
  uint16_t *puStack_100;
  code *pcStack_f8;
  code *pcStack_f0;
  secp256k1_modinv64_signed62 local_e8;
  secp256k1_modinv64_modinfo local_b8;
  ushort local_88 [16];
  code *local_68;
  uint16_t *local_60;
  uint16_t local_58;
  undefined8 local_56;
  undefined6 uStack_4e;
  undefined2 uStack_48;
  undefined6 uStack_46;
  undefined8 uStack_40;
  
  psVar24 = &local_e8;
  psVar25 = &local_e8;
  local_e8.v[0] = 0;
  local_e8.v[1] = 0;
  local_e8.v[2] = 0;
  local_e8.v[3] = 0;
  local_e8.v[4] = 0;
  uVar22 = 0;
  do {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar22 >> 1;
    local_e8.v[((byte)((uVar22 & 0xffffffff) >> 1) & 0x7f) / 0x1f] =
         local_e8.v[((byte)((uVar22 & 0xffffffff) >> 1) & 0x7f) / 0x1f] |
         (ulong)((in[uVar22 >> 4 & 0xfffffff] >> ((uint)uVar22 & 0xf) & 1) != 0) <<
         ((char)(SUB164(auVar3 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' + (char)uVar22 &
         0x3fU);
    uVar22 = uVar22 + 1;
  } while ((int)uVar22 != 0x100);
  local_68 = (code *)(local_e8.v[1] | local_e8.v[0] | local_e8.v[2] | local_e8.v[3] | local_e8.v[4])
  ;
  local_b8.modulus.v[0] = 0;
  local_b8.modulus.v[1] = 0;
  local_b8.modulus.v[2] = 0;
  local_b8.modulus.v[3] = 0;
  local_b8.modulus.v[4] = 0;
  modinfo = (secp256k1_modinv64_modinfo *)0x0;
  do {
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (ulong)modinfo >> 1;
    piVar1 = local_b8.modulus.v + ((byte)(((ulong)modinfo & 0xffffffff) >> 1) & 0x7f) / 0x1f;
    *piVar1 = *piVar1 | (ulong)((mod[(ulong)modinfo >> 4 & 0xfffffff] >> ((uint)modinfo & 0xf) & 1)
                               != 0) <<
                        ((char)(SUB164(auVar4 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' +
                         (char)modinfo & 0x3fU);
    iVar10 = local_b8.modulus.v[0];
    modinfo = (secp256k1_modinv64_modinfo *)((long)(modinfo->modulus).v + 1);
  } while ((int)modinfo != 0x100);
  pcVar31 = (code *)0x3fffffffffffffff;
  pcStack_f0 = (code *)0x160051;
  out_00 = (uint16_t *)local_b8.modulus.v[0];
  uVar16 = modinv2p64(local_b8.modulus.v[0]);
  pcVar12 = local_68;
  local_b8.modulus_inv62 = uVar16 & 0x3fffffffffffffff;
  uVar22 = iVar10 * uVar16 & 0x3fffffffffffffff;
  if (uVar22 != 1) goto LAB_0016046f;
  uVar22 = 0x3fffffffffffffff;
  if (local_68 == (code *)0x0) {
LAB_001601d2:
    local_e8.v[2] = 0;
    local_e8.v[3] = 0;
    local_e8.v[0] = 0;
    local_e8.v[1] = 0;
    local_e8.v[4] = 0;
    uVar22 = 0;
    do {
      auVar7._8_8_ = 0;
      auVar7._0_8_ = uVar22 >> 1;
      local_e8.v[((byte)((uVar22 & 0xffffffff) >> 1) & 0x7f) / 0x1f] =
           local_e8.v[((byte)((uVar22 & 0xffffffff) >> 1) & 0x7f) / 0x1f] |
           (ulong)((in[uVar22 >> 4 & 0xfffffff] >> ((uint)uVar22 & 0xf) & 1) != 0) <<
           ((char)(SUB164(auVar7 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' + (char)uVar22 &
           0x3fU);
      uVar22 = uVar22 + 1;
    } while ((int)uVar22 != 0x100);
    local_60 = mod;
    iVar14 = 8;
    do {
      uVar22 = ((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
               secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) + secp256k1_test_state[0]
               >> 0x3e;
      lVar17 = local_b8.modulus.v[uVar22];
      if (lVar17 < 1) {
        if ((lVar17 < 0) && (lVar21 = local_b8.modulus.v[uVar22 + 1], -0x4000000000000000 < lVar21))
        {
          local_b8.modulus.v[uVar22] = lVar17 + 0x4000000000000000;
          lVar21 = lVar21 + -1;
          goto LAB_001602a2;
        }
      }
      else {
        lVar21 = local_b8.modulus.v[uVar22 + 1];
        if (lVar21 < 0x4000000000000000) {
          local_b8.modulus.v[uVar22] = lVar17 + -0x4000000000000000;
          lVar21 = lVar21 + 1;
LAB_001602a2:
          local_b8.modulus.v[uVar22 + 1] = lVar21;
        }
      }
      uVar28 = secp256k1_test_state[1] << 0x11;
      uVar23 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
      uVar22 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
      secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar23;
      secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar22;
      secp256k1_test_state[2] = uVar23 ^ uVar28;
      secp256k1_test_state[3] = uVar22 << 0x2d | uVar22 >> 0x13;
      iVar14 = iVar14 + -1;
    } while (iVar14 != 0);
    mod = (uint16_t *)(ulong)(pcVar12 != (code *)0x0);
    uVar22 = 0x3fffffffffffff01;
    while( true ) {
      cVar29 = (char)uVar22;
      pcVar31 = secp256k1_modinv64_var;
      if (cVar29 != '\0') {
        pcVar31 = secp256k1_modinv64;
      }
      pcStack_f0 = (code *)0x16032c;
      (*pcVar31)(&local_e8);
      out[8] = 0;
      out[9] = 0;
      out[10] = 0;
      out[0xb] = 0;
      out[0xc] = 0;
      out[0xd] = 0;
      out[0xe] = 0;
      out[0xf] = 0;
      out[0] = 0;
      out[1] = 0;
      out[2] = 0;
      out[3] = 0;
      out[4] = 0;
      out[5] = 0;
      out[6] = 0;
      out[7] = 0;
      uVar23 = 0;
      do {
        auVar8._8_8_ = 0;
        auVar8._0_8_ = uVar23 >> 1;
        out[uVar23 >> 4 & 0xfffffff] =
             out[uVar23 >> 4 & 0xfffffff] |
             (ushort)(((ulong)local_e8.v[((byte)((uVar23 & 0xffffffff) >> 1) & 0x7f) / 0x1f] >>
                       ((ulong)((SUB164(auVar8 * ZEXT816(0x8421084210842109),8) >> 4) * 2 +
                               (int)uVar23) & 0x3f) & 1) != 0) << ((byte)uVar23 & 0xf);
        uVar23 = uVar23 + 1;
      } while ((int)uVar23 != 0x100);
      out_00 = local_88;
      pcStack_f0 = (code *)0x16039d;
      modinfo = (secp256k1_modinv64_modinfo *)out;
      mulmod256(out_00,out,in,local_60);
      if (local_88[0] != (pcVar12 != (code *)0x0)) break;
      lVar17 = 1;
      do {
        if (local_88[lVar17] != 0) {
          pcStack_f0 = (code *)0x160465;
          test_modinv64_uint16_cold_4();
          goto LAB_00160465;
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 != 0x10);
      pcStack_f0 = (code *)0x1603cd;
      (*pcVar31)(&local_e8);
      local_88[8] = 0;
      local_88[9] = 0;
      local_88[10] = 0;
      local_88[0xb] = 0;
      local_88[0xc] = 0;
      local_88[0xd] = 0;
      local_88[0xe] = 0;
      local_88[0xf] = 0;
      local_88[0] = 0;
      local_88[1] = 0;
      local_88[2] = 0;
      local_88[3] = 0;
      local_88[4] = 0;
      local_88[5] = 0;
      local_88[6] = 0;
      local_88[7] = 0;
      modinfo = (secp256k1_modinv64_modinfo *)0x0;
      do {
        auVar9._8_8_ = 0;
        auVar9._0_8_ = (ulong)modinfo >> 1;
        out_00 = (uint16_t *)
                 ((ulong)(((ulong)local_e8.v
                                  [((byte)(((ulong)modinfo & 0xffffffff) >> 1) & 0x7f) / 0x1f] >>
                           ((ulong)((SUB164(auVar9 * ZEXT816(0x8421084210842109),8) >> 4) * 2 +
                                   (int)modinfo) & 0x3f) & 1) != 0) << ((byte)modinfo & 0xf));
        local_88[(ulong)modinfo >> 4 & 0xfffffff] =
             local_88[(ulong)modinfo >> 4 & 0xfffffff] | (ushort)out_00;
        modinfo = (secp256k1_modinv64_modinfo *)((long)(modinfo->modulus).v + 1);
      } while ((int)modinfo != 0x100);
      lVar17 = 0;
      do {
        if (local_88[lVar17] != in[lVar17]) goto LAB_00160465;
        lVar17 = lVar17 + 1;
      } while (lVar17 != 0x10);
      uVar22 = 0;
      if (cVar29 == '\0') {
        return;
      }
    }
    goto LAB_0016046a;
  }
  pcStack_f0 = (code *)0x160094;
  mulmod256(local_88,in,in,mod);
  local_e8.v[2] = 0;
  local_e8.v[3] = 0;
  local_e8.v[0] = 0;
  local_e8.v[1] = 0;
  local_e8.v[4] = 0;
  uVar23 = 0;
  do {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar23 >> 1;
    local_e8.v[((byte)((uVar23 & 0xffffffff) >> 1) & 0x7f) / 0x1f] =
         local_e8.v[((byte)((uVar23 & 0xffffffff) >> 1) & 0x7f) / 0x1f] |
         (ulong)((local_88[uVar23 >> 4 & 0xfffffff] >> ((uint)uVar23 & 0xf) & 1) != 0) <<
         ((char)(SUB164(auVar5 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' + (char)uVar23 &
         0x3fU);
    uVar23 = uVar23 + 1;
  } while ((int)uVar23 != 0x100);
  modinfo = &local_b8;
  pcStack_f0 = (code *)0x16010a;
  uVar13 = secp256k1_jacobi64_maybe_var(&local_e8,modinfo);
  pcVar31 = pcVar12;
  if (uVar13 < 2) {
    local_58 = *mod - 1;
    local_56 = *(undefined8 *)(mod + 1);
    uStack_40 = *(undefined8 *)(mod + 0xc);
    uStack_4e = (undefined6)*(undefined8 *)(mod + 5);
    uStack_48 = (undefined2)*(undefined8 *)(mod + 8);
    uStack_46 = (undefined6)((ulong)*(undefined8 *)(mod + 8) >> 0x10);
    pcStack_f0 = (code *)0x160143;
    mulmod256(local_88,local_88,&local_58,mod);
    local_e8.v[2] = 0;
    local_e8.v[3] = 0;
    local_e8.v[0] = 0;
    local_e8.v[1] = 0;
    local_e8.v[4] = 0;
    uVar23 = 0;
    do {
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar23 >> 1;
      local_e8.v[((byte)((uVar23 & 0xffffffff) >> 1) & 0x7f) / 0x1f] =
           local_e8.v[((byte)((uVar23 & 0xffffffff) >> 1) & 0x7f) / 0x1f] |
           (ulong)((local_88[uVar23 >> 4 & 0xfffffff] >> ((uint)uVar23 & 0xf) & 1) != 0) <<
           ((char)(SUB164(auVar6 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' + (char)uVar23 &
           0x3fU);
      uVar23 = uVar23 + 1;
    } while ((int)uVar23 != 0x100);
    modinfo = &local_b8;
    pcStack_f0 = (code *)0x1601b9;
    iVar14 = secp256k1_jacobi64_maybe_var(&local_e8,modinfo);
    if ((iVar14 != 0) && (iVar14 != 1 - (*mod & 2))) goto LAB_00160479;
    goto LAB_001601d2;
  }
LAB_00160474:
  psVar25 = psVar24;
  pcStack_f0 = (code *)0x160479;
  test_modinv64_uint16_cold_6();
LAB_00160479:
  pcStack_f0 = modinv2p64;
  test_modinv64_uint16_cold_2();
  if (((ulong)psVar25 & 1) != 0) {
    iVar14 = 6;
    do {
      iVar14 = iVar14 + -1;
    } while (iVar14 != 0);
    return;
  }
  pcStack_f8 = secp256k1_jacobi32_maybe_var;
  modinv2p64_cold_1();
  pcStack_f8 = (code *)0x8421084210842109;
  puStack_100 = out;
  puStack_108 = in;
  pcStack_110 = pcVar31;
  uStack_118 = uVar22;
  puStack_120 = mod;
  sStack_178.v[8] = (int32_t)(modinfo->modulus).v[4];
  iVar10 = (modinfo->modulus).v[0];
  sStack_178.v._16_8_ = (modinfo->modulus).v[2];
  sStack_178.v._24_8_ = (modinfo->modulus).v[3];
  sStack_178.v[0] = (int)iVar10;
  sStack_178.v[1] = (int)((ulong)iVar10 >> 0x20);
  uVar11 = sStack_178.v._0_8_;
  sStack_178.v._8_8_ = (modinfo->modulus).v[1];
  sStack_148.v[8] = *(int32_t *)((long)psVar25 + 0x20);
  sStack_148.v._0_8_ = psVar25->v[0];
  sStack_148.v._8_8_ = *(undefined8 *)((long)psVar25 + 8);
  sStack_148.v._16_8_ = *(undefined8 *)((long)psVar25 + 0x10);
  sStack_148.v._24_8_ = *(undefined8 *)((long)psVar25 + 0x18);
  uVar22 = 9;
  iVar30 = -1;
  iVar14 = 0;
  sStack_178.v[0] = (int32_t)iVar10;
  uVar13 = sStack_178.v[0];
  sStack_178.v._0_8_ = uVar11;
  do {
    iVar19 = 0;
    if ((sStack_148.v[0] | 0xc0000000U) != 0) {
      for (; ((sStack_148.v[0] | 0xc0000000U) >> iVar19 & 1) == 0; iVar19 = iVar19 + 1) {
      }
    }
    iVar30 = iVar30 - iVar19;
    if (iVar19 == 0x1e) {
      sStack_190.u = 0x40000000;
      iStack_194 = 1;
      sStack_190.q = 0;
      sStack_190.v = 0;
    }
    else {
      uVar13 = sStack_178.v[1] << 0x1e | uVar13;
      iStack_194 = 1;
      sStack_190.u = 1 << ((byte)iVar19 & 0x1f);
      uVar20 = (uint)(sStack_148.v[1] << 0x1e | sStack_148.v[0]) >> ((byte)iVar19 & 0x1f);
      iVar19 = 0x1e - iVar19;
      sStack_190.v = 0;
      sStack_190.q = 0;
      do {
        uVar26 = uVar20;
        iVar32 = sStack_190.u;
        iVar27 = sStack_190.v;
        if (iVar30 < 0) {
          iVar30 = -iVar30;
          uVar26 = uVar13;
          iVar32 = sStack_190.q;
          uVar13 = uVar20;
          sStack_190.q = sStack_190.u;
          iVar27 = iStack_194;
          iStack_194 = sStack_190.v;
        }
        iVar2 = iVar30 + 1;
        if (iVar19 <= iVar30 + 1) {
          iVar2 = iVar19;
        }
        uVar15 = ((uint)(byte)(secp256k1_modinv32_inv256[uVar13 >> 1 & 0x7f] * (char)uVar26) <<
                 (-(char)iVar2 & 0x1fU)) >> (-(char)iVar2 & 0x1fU);
        uVar26 = uVar15 * uVar13 + uVar26;
        sStack_190.q = uVar15 * iVar32 + sStack_190.q;
        uVar20 = -1 << ((byte)iVar19 & 0x1f) | uVar26;
        iVar2 = 0;
        if (uVar20 != 0) {
          for (; (uVar20 >> iVar2 & 1) == 0; iVar2 = iVar2 + 1) {
          }
        }
        bVar18 = (byte)iVar2;
        uVar20 = uVar26 >> (bVar18 & 0x1f);
        sStack_190.u = iVar32 << (bVar18 & 0x1f);
        sStack_190.v = iVar27 << (bVar18 & 0x1f);
        iStack_194 = uVar15 * iVar27 + iStack_194;
        iVar30 = iVar30 - iVar2;
        iVar19 = iVar19 - iVar2;
      } while (iVar19 != 0);
    }
    uVar13 = (uint)uVar22;
    sStack_190.r = iStack_194;
    uStack_180 = uVar22;
    secp256k1_modinv32_update_fg_30_var(uVar13,&sStack_178,&sStack_148,&sStack_190);
    if (sStack_178.v[0] == 1) {
      if ((int)uVar13 < 2) {
        return;
      }
      uVar20 = 0;
      uVar23 = 1;
      do {
        uVar20 = uVar20 | sStack_178.v[uVar23];
        uVar23 = uVar23 + 1;
      } while (uVar22 != uVar23);
      if (uVar20 == 0) {
        return;
      }
    }
    uVar20 = uVar13 - 1;
    if (((int)(uVar13 - 2) < 0 || *(int *)((long)&uStack_180 + (long)(int)uVar13 * 4 + 4) != 0) ||
        (&iStack_14c)[(int)uVar13] != 0) {
      uVar20 = uVar13;
    }
    iVar14 = iVar14 + 1;
    uVar22 = (ulong)uVar20;
    uVar13 = sStack_178.v[0];
    if (iVar14 == 0x32) {
      return;
    }
  } while( true );
LAB_00160465:
  pcStack_f0 = (code *)0x16046a;
  test_modinv64_uint16_cold_5();
LAB_0016046a:
  pcStack_f0 = (code *)0x16046f;
  test_modinv64_uint16_cold_3();
LAB_0016046f:
  pcStack_f0 = (code *)0x160474;
  test_modinv64_uint16_cold_1();
  psVar24 = (secp256k1_modinv64_signed62 *)out_00;
  goto LAB_00160474;
}

Assistant:

static void test_modinv64_uint16(uint16_t* out, const uint16_t* in, const uint16_t* mod) {
    static const int64_t M62 = (int64_t)(UINT64_MAX >> 2);
    uint16_t tmp[16];
    secp256k1_modinv64_signed62 x;
    secp256k1_modinv64_modinfo m;
    int i, vartime, nonzero;

    uint16_to_signed62(&x, in);
    nonzero = (x.v[0] | x.v[1] | x.v[2] | x.v[3] | x.v[4]) != 0;
    uint16_to_signed62(&m.modulus, mod);

    /* compute 1/modulus mod 2^62 */
    m.modulus_inv62 = modinv2p64(m.modulus.v[0]) & M62;
    CHECK(((m.modulus_inv62 * m.modulus.v[0]) & M62) == 1);

    /* Test secp256k1_jacobi64_maybe_var. */
    if (nonzero) {
        int jac;
        uint16_t sqr[16], negone[16];
        mulmod256(sqr, in, in, mod);
        uint16_to_signed62(&x, sqr);
        /* Compute jacobi symbol of in^2, which must be 1 (or uncomputable). */
        jac = secp256k1_jacobi64_maybe_var(&x, &m);
        CHECK(jac == 0 || jac == 1);
        /* Then compute the jacobi symbol of -(in^2). x and -x have opposite
         * jacobi symbols if and only if (mod % 4) == 3. */
        negone[0] = mod[0] - 1;
        for (i = 1; i < 16; ++i) negone[i] = mod[i];
        mulmod256(sqr, sqr, negone, mod);
        uint16_to_signed62(&x, sqr);
        jac = secp256k1_jacobi64_maybe_var(&x, &m);
        CHECK(jac == 0 || jac == 1 - (mod[0] & 2));
    }

    uint16_to_signed62(&x, in);
    mutate_sign_signed62(&m.modulus);
    for (vartime = 0; vartime < 2; ++vartime) {
        /* compute inverse */
        (vartime ? secp256k1_modinv64_var : secp256k1_modinv64)(&x, &m);

        /* produce output */
        signed62_to_uint16(out, &x);

        /* check if the inverse times the input is 1 (mod m), unless x is 0. */
        mulmod256(tmp, out, in, mod);
        CHECK(tmp[0] == nonzero);
        for (i = 1; i < 16; ++i) CHECK(tmp[i] == 0);

        /* invert again */
        (vartime ? secp256k1_modinv64_var : secp256k1_modinv64)(&x, &m);

        /* check if the result is equal to the input */
        signed62_to_uint16(tmp, &x);
        for (i = 0; i < 16; ++i) CHECK(tmp[i] == in[i]);
    }
}